

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readBackgroundMatrices.hpp
# Opt level: O2

vector<std::optional<std::variant<njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::NoBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::TabulatedBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::SammyBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::FrohnerBackgroundRMatrix>_>,_std::allocator<std::optional<std::variant<njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::NoBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::TabulatedBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::SammyBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::FrohnerBackgroundRMatrix>_>_>_>
* __thiscall
njoy::ENDFtk::section::Type<2,151>::RMatrixLimited::BackgroundChannels::
readBackgroundMatrices<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
          (vector<std::optional<std::variant<njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::NoBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::TabulatedBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::SammyBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::FrohnerBackgroundRMatrix>_>,_std::allocator<std::optional<std::variant<njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::NoBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::TabulatedBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::SammyBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::FrohnerBackgroundRMatrix>_>_>_>
           *__return_storage_ptr__,BackgroundChannels *this,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *begin,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *end,long *lineNumber,int MAT,int MF,int MT,int NCH,int KBK)

{
  undefined8 *puVar1;
  char *args;
  int MAT_00;
  int args_1;
  bool bVar2;
  undefined4 in_stack_fffffffffffffe38;
  int iVar3;
  undefined4 in_stack_fffffffffffffe3c;
  long line;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  temp;
  ControlRecord cont;
  _Optional_payload_base<std::variant<njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::NoBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::TabulatedBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::SammyBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::FrohnerBackgroundRMatrix>_>
  local_168;
  
  MAT_00 = (int)lineNumber;
  local_168._M_engaged = false;
  std::
  vector<std::optional<std::variant<njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::NoBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::TabulatedBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::SammyBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::FrohnerBackgroundRMatrix>_>,_std::allocator<std::optional<std::variant<njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::NoBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::TabulatedBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::SammyBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::FrohnerBackgroundRMatrix>_>_>_>
  ::vector(__return_storage_ptr__,(long)MT,(value_type *)&local_168,(allocator_type *)&cont);
  std::
  _Optional_payload_base<std::variant<njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::NoBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::TabulatedBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::SammyBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::FrohnerBackgroundRMatrix>_>
  ::_M_reset(&local_168);
  if ((NCH < 0) || (MT < NCH)) {
    tools::Log::error<char_const*>
              ((char *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
    tools::Log::info<char_const*>
              ((char *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
    tools::Log::info<char_const*,int>("NCH value: {}",MT);
    tools::Log::info<char_const*,int>("KBK value: {}",NCH);
    puVar1 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar1 = getenv;
    __cxa_throw(puVar1,&std::exception::typeinfo,std::exception::~exception);
  }
  while( true ) {
    bVar2 = NCH == 0;
    NCH = NCH + -1;
    if (bVar2) {
      return __return_storage_ptr__;
    }
    temp._M_current = *(char **)this;
    line = (long)end->_M_current;
    iVar3 = MF;
    ControlRecord::ControlRecord<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              (&cont,&temp,begin,&line,MAT_00,MAT,MF);
    args_1 = (int)cont.
                  super_Base<njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>_>
                  .fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
                  _M_head_impl;
    if ((args_1 < 1) || (MT < args_1)) break;
    switch((int)cont.
                super_Base<njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>_>
                .fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                super__Tuple_impl<2UL,_long,_long,_long,_long>.
                super__Tuple_impl<3UL,_long,_long,_long>.super__Head_base<3UL,_long,_false>.
                _M_head_impl) {
    case 0:
      NoBackgroundRMatrix::
      NoBackgroundRMatrix<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                ((NoBackgroundRMatrix *)&local_168,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)this,begin,(long *)end,MAT_00,MAT,MF);
      std::
      optional<std::variant<njoy::ENDFtk::section::Type<2,151>::RMatrixLimited::NoBackgroundRMatrix,njoy::ENDFtk::section::Type<2,151>::RMatrixLimited::TabulatedBackgroundRMatrix,njoy::ENDFtk::section::Type<2,151>::RMatrixLimited::SammyBackgroundRMatrix,njoy::ENDFtk::section::Type<2,151>::RMatrixLimited::FrohnerBackgroundRMatrix>>
      ::operator=((optional<std::variant<njoy::ENDFtk::section::Type<2,151>::RMatrixLimited::NoBackgroundRMatrix,njoy::ENDFtk::section::Type<2,151>::RMatrixLimited::TabulatedBackgroundRMatrix,njoy::ENDFtk::section::Type<2,151>::RMatrixLimited::SammyBackgroundRMatrix,njoy::ENDFtk::section::Type<2,151>::RMatrixLimited::FrohnerBackgroundRMatrix>>
                   *)((__return_storage_ptr__->
                      super__Vector_base<std::optional<std::variant<njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::NoBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::TabulatedBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::SammyBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::FrohnerBackgroundRMatrix>_>,_std::allocator<std::optional<std::variant<njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::NoBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::TabulatedBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::SammyBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::FrohnerBackgroundRMatrix>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start + (args_1 - 1)),
                  (NoBackgroundRMatrix *)&local_168);
      break;
    case 1:
      TabulatedBackgroundRMatrix::
      TabulatedBackgroundRMatrix<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                ((TabulatedBackgroundRMatrix *)&local_168,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)this,begin,(long *)end,MAT_00,MAT,MF);
      std::
      optional<std::variant<njoy::ENDFtk::section::Type<2,151>::RMatrixLimited::NoBackgroundRMatrix,njoy::ENDFtk::section::Type<2,151>::RMatrixLimited::TabulatedBackgroundRMatrix,njoy::ENDFtk::section::Type<2,151>::RMatrixLimited::SammyBackgroundRMatrix,njoy::ENDFtk::section::Type<2,151>::RMatrixLimited::FrohnerBackgroundRMatrix>>
      ::operator=((optional<std::variant<njoy::ENDFtk::section::Type<2,151>::RMatrixLimited::NoBackgroundRMatrix,njoy::ENDFtk::section::Type<2,151>::RMatrixLimited::TabulatedBackgroundRMatrix,njoy::ENDFtk::section::Type<2,151>::RMatrixLimited::SammyBackgroundRMatrix,njoy::ENDFtk::section::Type<2,151>::RMatrixLimited::FrohnerBackgroundRMatrix>>
                   *)((__return_storage_ptr__->
                      super__Vector_base<std::optional<std::variant<njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::NoBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::TabulatedBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::SammyBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::FrohnerBackgroundRMatrix>_>,_std::allocator<std::optional<std::variant<njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::NoBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::TabulatedBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::SammyBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::FrohnerBackgroundRMatrix>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start + (args_1 - 1)),
                  (TabulatedBackgroundRMatrix *)&local_168);
      Type<2,_151>::RMatrixLimited::TabulatedBackgroundRMatrix::~TabulatedBackgroundRMatrix
                ((TabulatedBackgroundRMatrix *)&local_168);
      break;
    case 2:
      SammyBackgroundRMatrix::
      SammyBackgroundRMatrix<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                ((SammyBackgroundRMatrix *)&local_168,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)this,begin,(long *)end,MAT_00,MAT,MF);
      std::
      optional<std::variant<njoy::ENDFtk::section::Type<2,151>::RMatrixLimited::NoBackgroundRMatrix,njoy::ENDFtk::section::Type<2,151>::RMatrixLimited::TabulatedBackgroundRMatrix,njoy::ENDFtk::section::Type<2,151>::RMatrixLimited::SammyBackgroundRMatrix,njoy::ENDFtk::section::Type<2,151>::RMatrixLimited::FrohnerBackgroundRMatrix>>
      ::operator=((optional<std::variant<njoy::ENDFtk::section::Type<2,151>::RMatrixLimited::NoBackgroundRMatrix,njoy::ENDFtk::section::Type<2,151>::RMatrixLimited::TabulatedBackgroundRMatrix,njoy::ENDFtk::section::Type<2,151>::RMatrixLimited::SammyBackgroundRMatrix,njoy::ENDFtk::section::Type<2,151>::RMatrixLimited::FrohnerBackgroundRMatrix>>
                   *)((__return_storage_ptr__->
                      super__Vector_base<std::optional<std::variant<njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::NoBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::TabulatedBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::SammyBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::FrohnerBackgroundRMatrix>_>,_std::allocator<std::optional<std::variant<njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::NoBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::TabulatedBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::SammyBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::FrohnerBackgroundRMatrix>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start + (args_1 - 1)),
                  (SammyBackgroundRMatrix *)&local_168);
      break;
    case 3:
      FrohnerBackgroundRMatrix::
      FrohnerBackgroundRMatrix<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                ((FrohnerBackgroundRMatrix *)&local_168,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)this,begin,(long *)end,MAT_00,MAT,MF);
      std::
      optional<std::variant<njoy::ENDFtk::section::Type<2,151>::RMatrixLimited::NoBackgroundRMatrix,njoy::ENDFtk::section::Type<2,151>::RMatrixLimited::TabulatedBackgroundRMatrix,njoy::ENDFtk::section::Type<2,151>::RMatrixLimited::SammyBackgroundRMatrix,njoy::ENDFtk::section::Type<2,151>::RMatrixLimited::FrohnerBackgroundRMatrix>>
      ::operator=((optional<std::variant<njoy::ENDFtk::section::Type<2,151>::RMatrixLimited::NoBackgroundRMatrix,njoy::ENDFtk::section::Type<2,151>::RMatrixLimited::TabulatedBackgroundRMatrix,njoy::ENDFtk::section::Type<2,151>::RMatrixLimited::SammyBackgroundRMatrix,njoy::ENDFtk::section::Type<2,151>::RMatrixLimited::FrohnerBackgroundRMatrix>>
                   *)((__return_storage_ptr__->
                      super__Vector_base<std::optional<std::variant<njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::NoBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::TabulatedBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::SammyBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::FrohnerBackgroundRMatrix>_>,_std::allocator<std::optional<std::variant<njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::NoBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::TabulatedBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::SammyBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::FrohnerBackgroundRMatrix>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start + (args_1 - 1)),
                  (FrohnerBackgroundRMatrix *)&local_168);
      break;
    default:
      tools::Log::error<char_const*>((char *)CONCAT44(in_stack_fffffffffffffe3c,iVar3));
      tools::Log::info<char_const*>((char *)CONCAT44(in_stack_fffffffffffffe3c,iVar3));
      args = "LBK value: {}";
      args_1 = (int)cont.
                    super_Base<njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>_>
                    .fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                    super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                    super__Tuple_impl<2UL,_long,_long,_long,_long>.
                    super__Tuple_impl<3UL,_long,_long,_long>.super__Head_base<3UL,_long,_false>.
                    _M_head_impl;
      goto LAB_001335c6;
    }
  }
  tools::Log::error<char_const*>((char *)CONCAT44(in_stack_fffffffffffffe3c,iVar3));
  tools::Log::info<char_const*>((char *)CONCAT44(in_stack_fffffffffffffe3c,iVar3));
  tools::Log::info<char_const*,int>("NCH value: {}",MT);
  args = "LCH value: {}";
LAB_001335c6:
  tools::Log::info<char_const*,int>(args,args_1);
  puVar1 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar1 = getenv;
  __cxa_throw(puVar1,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

static std::vector< std::optional< BackgroundRMatrix > >
readBackgroundMatrices( Iterator& begin, const Iterator& end, long& lineNumber,
                        int MAT, int MF, int MT,
                        int NCH, int KBK ) {

  std::vector< std::optional< BackgroundRMatrix > >
  background( NCH, std::nullopt );

  if ( ( KBK < 0 ) || ( KBK > NCH ) ) {

    Log::error( "Encountered illegal KBK value" );
    Log::info( "KBK must be between zero and NCH" );
    Log::info( "NCH value: {}", NCH );
    Log::info( "KBK value: {}", KBK );
    throw std::exception();
  }

  while( KBK-- ) {

    Iterator temp = begin;
    long line = lineNumber;
    ControlRecord cont( temp, end, line, MAT, MF, MT );
    int LCH = cont.L1();
    int LBK = cont.L2();

    if ( ( LCH <= 0 ) || ( LCH > NCH ) ) {

      Log::error( "Encountered illegal LCH value" );
      Log::info( "LCH must be between 1 and NCH" );
      Log::info( "NCH value: {}", NCH );
      Log::info( "LCH value: {}", LCH );
      throw std::exception();
    }

    switch ( LBK ) {

      case 0 : {

        background[ LCH - 1 ] =
            NoBackgroundRMatrix( begin, end, lineNumber, MAT, MF, MT );
        break;
      }
      case 1 : {

        background[ LCH - 1 ] =
            TabulatedBackgroundRMatrix( begin, end, lineNumber, MAT, MF, MT );
        break;
      }
      case 2 : {

        background[ LCH - 1 ] =
            SammyBackgroundRMatrix( begin, end, lineNumber, MAT, MF, MT );
        break;
      }
      case 3 : {

        background[ LCH - 1 ] =
            FrohnerBackgroundRMatrix( begin, end, lineNumber, MAT, MF, MT );
        break;
      }
      default : {

        Log::error( "Encountered illegal LBK value" );
        Log::info( "LBK must be between 0 and 3" );
        Log::info( "LBK value: {}", LBK );
        throw std::exception();
      }
    }
  }
  return background;
}